

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlRotatef(float angle,float x,float y,float z)

{
  Matrix left;
  undefined1 auVar1 [56];
  Matrix *pMVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Matrix matRotation;
  float local_ec;
  float local_e8;
  float local_e4;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  fVar3 = z * z + x * x + y * y;
  local_ec = y;
  local_e8 = x;
  local_e4 = z;
  if ((fVar3 != 1.0) || (NAN(fVar3))) {
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar3 = 1.0 / fVar3;
      local_e8 = x * fVar3;
      local_ec = y * fVar3;
      local_e4 = z * fVar3;
    }
  }
  fVar3 = sinf(angle * 0.017453292);
  fVar4 = cosf(angle * 0.017453292);
  pMVar2 = RLGL.State.currentMatrix;
  fVar5 = 1.0 - fVar4;
  fVar6 = local_ec * local_e8 * fVar5;
  fVar7 = local_e4 * local_e8 * fVar5;
  local_d8 = CONCAT44(fVar6 - local_e4 * fVar3,local_e8 * local_e8 * fVar5 + fVar4);
  local_c8 = CONCAT44(local_ec * local_ec * fVar5 + fVar4,fVar6 + local_e4 * fVar3);
  fVar6 = local_e4 * local_ec * fVar5;
  local_b8 = CONCAT44(fVar6 + local_e8 * fVar3,fVar7 - local_ec * fVar3);
  auVar1 = ZEXT4456(CONCAT440(local_e4 * local_e4 * fVar5 + fVar4,
                              CONCAT832(local_b8,CONCAT428(0,CONCAT424(fVar6 - local_e8 * fVar3,
                                                                       CONCAT816(local_c8,CONCAT412(
                                                  0,CONCAT48(fVar7 + local_ec * fVar3,local_d8))))))
                             ));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar1._0_4_;
  left.m4 = (float)auVar1._4_4_;
  left.m8 = (float)auVar1._8_4_;
  left.m12 = (float)auVar1._12_4_;
  left.m1 = (float)auVar1._16_4_;
  left.m5 = (float)auVar1._20_4_;
  left.m9 = (float)auVar1._24_4_;
  left.m13 = (float)auVar1._28_4_;
  left.m2 = (float)auVar1._32_4_;
  left.m6 = (float)auVar1._36_4_;
  left.m10 = (float)auVar1._40_4_;
  left.m14 = (float)auVar1._44_4_;
  left.m3 = (float)auVar1._48_4_;
  left.m7 = (float)auVar1._52_4_;
  rlMatrixMultiply(left,*RLGL.State.currentMatrix);
  pMVar2->m3 = (float)(undefined4)local_20;
  pMVar2->m7 = (float)local_20._4_4_;
  pMVar2->m11 = (float)(undefined4)uStack_18;
  pMVar2->m15 = (float)uStack_18._4_4_;
  pMVar2->m2 = (float)(undefined4)local_30;
  pMVar2->m6 = (float)local_30._4_4_;
  pMVar2->m10 = (float)(undefined4)uStack_28;
  pMVar2->m14 = (float)uStack_28._4_4_;
  pMVar2->m1 = (float)(undefined4)local_40;
  pMVar2->m5 = (float)local_40._4_4_;
  pMVar2->m9 = (float)(undefined4)uStack_38;
  pMVar2->m13 = (float)uStack_38._4_4_;
  pMVar2->m0 = (float)(undefined4)local_50;
  pMVar2->m4 = (float)local_50._4_4_;
  pMVar2->m8 = (float)(undefined4)uStack_48;
  pMVar2->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlRotatef(float angle, float x, float y, float z)
{
    Matrix matRotation = rlMatrixIdentity();

    // Axis vector (x, y, z) normalization
    float lengthSquared = x*x + y*y + z*z;
    if ((lengthSquared != 1.0f) && (lengthSquared != 0.0f))
    {
        float inverseLength = 1.0f/sqrtf(lengthSquared);
        x *= inverseLength;
        y *= inverseLength;
        z *= inverseLength;
    }

    // Rotation matrix generation
    float sinres = sinf(DEG2RAD*angle);
    float cosres = cosf(DEG2RAD*angle);
    float t = 1.0f - cosres;

    matRotation.m0 = x*x*t + cosres;
    matRotation.m1 = y*x*t + z*sinres;
    matRotation.m2 = z*x*t - y*sinres;
    matRotation.m3 = 0.0f;

    matRotation.m4 = x*y*t - z*sinres;
    matRotation.m5 = y*y*t + cosres;
    matRotation.m6 = z*y*t + x*sinres;
    matRotation.m7 = 0.0f;

    matRotation.m8 = x*z*t + y*sinres;
    matRotation.m9 = y*z*t - x*sinres;
    matRotation.m10 = z*z*t + cosres;
    matRotation.m11 = 0.0f;

    matRotation.m12 = 0.0f;
    matRotation.m13 = 0.0f;
    matRotation.m14 = 0.0f;
    matRotation.m15 = 1.0f;

    // NOTE: We transpose matrix with multiplication order
    *RLGL.State.currentMatrix = rlMatrixMultiply(matRotation, *RLGL.State.currentMatrix);
}